

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

bool __thiscall WorldShuffler::is_region_avoidable(WorldShuffler *this,WorldRegion *region)

{
  bool bVar1;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> *forbidden_nodes;
  WorldNode *start_node;
  WorldNode *end_node;
  vector<Item_*,_std::allocator<Item_*>_> local_178;
  undefined1 local_150 [8];
  WorldSolver solver;
  WorldRegion *region_local;
  WorldShuffler *this_local;
  
  solver._debug_log.m_value = (json_value)region;
  WorldSolver::WorldSolver((WorldSolver *)local_150,this->_world);
  forbidden_nodes = WorldRegion::nodes((WorldRegion *)solver._debug_log.m_value.object);
  WorldSolver::forbid_taking_items_from_nodes((WorldSolver *)local_150,forbidden_nodes);
  start_node = RandomizerWorld::spawn_node(this->_world);
  end_node = RandomizerWorld::end_node(this->_world);
  World::starting_inventory(&local_178,&this->_world->super_World);
  bVar1 = WorldSolver::try_to_solve((WorldSolver *)local_150,start_node,end_node,&local_178);
  std::vector<Item_*,_std::allocator<Item_*>_>::~vector(&local_178);
  WorldSolver::~WorldSolver((WorldSolver *)local_150);
  return bVar1;
}

Assistant:

bool WorldShuffler::is_region_avoidable(WorldRegion* region) const
{
    WorldSolver solver(_world);
    solver.forbid_taking_items_from_nodes(region->nodes());
    return solver.try_to_solve(_world.spawn_node(), _world.end_node(), _world.starting_inventory());
}